

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpointer.c
# Opt level: O0

void xmlXPtrRangeCheckOrder(xmlXPathObjectPtr range)

{
  void *pvVar1;
  int iVar2;
  xmlNodePtr tmp2;
  int tmp;
  xmlXPathObjectPtr range_local;
  
  if ((((range != (xmlXPathObjectPtr)0x0) && (range->type == XPATH_RANGE)) &&
      (range->user2 != (void *)0x0)) &&
     (iVar2 = xmlXPtrCmpPoints((xmlNodePtr)range->user,range->index,(xmlNodePtr)range->user2,
                               range->index2), iVar2 == -1)) {
    pvVar1 = range->user;
    range->user = range->user2;
    range->user2 = pvVar1;
    iVar2 = range->index;
    range->index = range->index2;
    range->index2 = iVar2;
  }
  return;
}

Assistant:

static void
xmlXPtrRangeCheckOrder(xmlXPathObjectPtr range) {
    int tmp;
    xmlNodePtr tmp2;
    if (range == NULL)
	return;
    if (range->type != XPATH_RANGE)
	return;
    if (range->user2 == NULL)
	return;
    tmp = xmlXPtrCmpPoints(range->user, range->index,
	                     range->user2, range->index2);
    if (tmp == -1) {
	tmp2 = range->user;
	range->user = range->user2;
	range->user2 = tmp2;
	tmp = range->index;
	range->index = range->index2;
	range->index2 = tmp;
    }
}